

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

void ImGui::TableHeader(char *label)

{
  ImVec2 *pIVar1;
  ImVec2 IVar2;
  bool bVar3;
  ImGuiID IVar4;
  ImGuiTableColumn *text_size_if_known;
  char *pcVar5;
  ImVec2 *in_RDI;
  float _y;
  float fVar6;
  float fVar7;
  ImVec2 IVar8;
  ImVec2 IVar9;
  ImRect IVar10;
  ImDrawList *unaff_retaddr;
  bool text_clipped;
  ImGuiSortDirection sort_direction;
  float y;
  float x;
  float ellipsis_max;
  ImGuiTableColumn *next_column;
  ImGuiTableColumn *prev_column;
  ImU32 col;
  bool pressed;
  bool held;
  bool hovered;
  ImRect bb;
  ImGuiID id;
  bool selected;
  float max_pos_x;
  float ARROW_SCALE;
  char sort_order_suf [4];
  float w_sort_text;
  float w_arrow;
  float label_height;
  ImRect cell_r;
  ImVec2 label_pos;
  ImVec2 label_size;
  char *label_end;
  ImGuiTableColumn *column;
  int column_n;
  ImGuiTable *table;
  ImGuiWindow *window;
  ImGuiContext *g;
  undefined4 in_stack_fffffffffffffec8;
  float in_stack_fffffffffffffecc;
  ImGuiHoveredFlags flags;
  undefined8 in_stack_fffffffffffffed0;
  int iVar11;
  undefined8 in_stack_fffffffffffffed8;
  float in_stack_fffffffffffffee0;
  int in_stack_fffffffffffffee4;
  ImRect *in_stack_fffffffffffffee8;
  ImGuiWindow *in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  undefined1 append_to_sort_specs;
  float col_00;
  uint in_stack_ffffffffffffff0c;
  uint flags_00;
  undefined1 hide_text_after_hash;
  bool *in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff18;
  float in_stack_ffffffffffffff1c;
  float in_stack_ffffffffffffff20;
  float in_stack_ffffffffffffff24;
  ImVec2 in_stack_ffffffffffffff28;
  float in_stack_ffffffffffffff30;
  float in_stack_ffffffffffffff34;
  ImVec2 local_c4;
  float local_bc;
  float local_b8;
  float local_b4;
  ImGuiTableColumn *local_b0;
  ImGuiTableColumn *local_a8;
  ImU32 local_a0;
  byte local_9b;
  byte local_9a;
  byte local_99;
  ImVec2 local_98 [2];
  ImGuiNavHighlightFlags in_stack_ffffffffffffff78;
  ImGuiID in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff84;
  uint uVar12;
  float local_74;
  float fVar13;
  float local_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float local_40;
  float fStack_3c;
  undefined4 in_stack_ffffffffffffffd8;
  int i;
  ImGuiTable *text;
  ImGuiWindow *pIVar14;
  ImGuiContext *pos_max;
  
  pIVar14 = GImGui->CurrentWindow;
  if ((pIVar14->SkipItems & 1U) == 0) {
    text = GImGui->CurrentTable;
    i = text->CurrentColumn;
    pos_max = GImGui;
    text_size_if_known = ImSpan<ImGuiTableColumn>::operator[](&text->Columns,i);
    if (in_RDI == (ImVec2 *)0x0) {
      in_RDI = (ImVec2 *)0x1dafde;
    }
    pcVar5 = FindRenderedTextEnd((char *)in_RDI,(char *)0x0);
    IVar8 = CalcTextSize((char *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                         (char *)in_stack_fffffffffffffef0,
                         SUB81((ulong)in_stack_fffffffffffffee8 >> 0x38,0),
                         SUB84(in_stack_fffffffffffffee8,0));
    IVar2 = (pIVar14->DC).CursorPos;
    IVar10 = TableGetCellBgRect((ImGuiTable *)
                                CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                                (int)((ulong)in_stack_fffffffffffffed8 >> 0x20));
    fStack_3c = IVar8.y;
    _y = ImMax<float>(fStack_3c,-text->CellPaddingY + -text->CellPaddingY + text->RowMinHeight);
    fVar13 = 0.0;
    local_74 = 0.0;
    memset(&stack0xffffffffffffff98,0,4);
    if ((((text->Flags & 8U) != 0) && ((text_size_if_known->Flags & 0x100U) == 0)) &&
       (fVar13 = ImFloor(pos_max->FontSize * 0.65 + (pos_max->Style).FramePadding.x),
       '\0' < text_size_if_known->SortOrder)) {
      in_stack_ffffffffffffff1c = 0.0;
      in_stack_ffffffffffffff10 = (bool *)&stack0xffffffffffffff98;
      ImFormatString(in_stack_ffffffffffffff10,4,"%d",
                     (ulong)((int)text_size_if_known->SortOrder + 1));
      in_stack_ffffffffffffff20 = (pos_max->Style).ItemInnerSpacing.x;
      IVar9 = CalcTextSize((char *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                           (char *)in_stack_fffffffffffffef0,
                           SUB81((ulong)in_stack_fffffffffffffee8 >> 0x38,0),
                           SUB84(in_stack_fffffffffffffee8,0));
      local_74 = IVar9.x;
      local_74 = in_stack_ffffffffffffff20 + local_74;
    }
    local_48 = IVar2.x;
    local_40 = IVar8.x;
    fVar6 = local_48 + local_40 + local_74 + fVar13;
    fVar7 = ImMax<float>(text_size_if_known->ContentMaxXHeadersUsed,text_size_if_known->WorkMaxX);
    text_size_if_known->ContentMaxXHeadersUsed = fVar7;
    fVar6 = ImMax<float>(text_size_if_known->ContentMaxXHeadersIdeal,fVar6);
    text_size_if_known->ContentMaxXHeadersIdeal = fVar6;
    flags_00 = in_stack_ffffffffffffff0c & 0xffffff;
    if (((text->IsContextPopupOpen & 1U) != 0) &&
       (flags_00 = in_stack_ffffffffffffff0c & 0xffffff, text->ContextPopupColumn == i)) {
      flags_00 = CONCAT13(text->InstanceInteracted == text->InstanceCurrent,
                          (int3)in_stack_ffffffffffffff0c);
    }
    uVar12 = CONCAT13((char)(flags_00 >> 0x18),(int3)in_stack_ffffffffffffff84);
    IVar4 = ImGuiWindow::GetID(in_stack_fffffffffffffef0,(char *)in_stack_fffffffffffffee8,
                               (char *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0)
                              );
    col_00 = IVar10.Min.y;
    local_50 = IVar10.Max.x;
    fStack_4c = IVar10.Max.y;
    fVar6 = (pos_max->Style).CellPadding.y;
    fVar7 = local_50;
    ImMax<float>(fStack_4c,fVar6 + fVar6 + col_00 + _y);
    ImRect::ImRect((ImRect *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                   (float)((ulong)in_stack_fffffffffffffed8 >> 0x20),
                   (float)in_stack_fffffffffffffed8,
                   (float)((ulong)in_stack_fffffffffffffed0 >> 0x20),
                   (float)in_stack_fffffffffffffed0);
    ImVec2::ImVec2(local_98,0.0,_y);
    ItemSize((ImVec2 *)in_stack_fffffffffffffef0,(float)((ulong)in_stack_fffffffffffffee8 >> 0x20));
    bVar3 = ItemAdd((ImRect *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                    (ImGuiID)((ulong)in_stack_fffffffffffffef0 >> 0x20),in_stack_fffffffffffffee8);
    append_to_sort_specs = (undefined1)((uint)in_stack_fffffffffffffefc >> 0x18);
    iVar11 = (int)((ulong)in_stack_fffffffffffffee8 >> 0x20);
    if (bVar3) {
      local_9b = ButtonBehavior((ImRect *)in_stack_ffffffffffffff28,
                                (ImGuiID)in_stack_ffffffffffffff24,
                                (bool *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18
                                                ),in_stack_ffffffffffffff10,flags_00);
      hide_text_after_hash = (undefined1)(flags_00 >> 0x18);
      if (pos_max->ActiveId != IVar4) {
        SetItemAllowOverlap();
      }
      if ((((local_9a & 1) == 0) && ((local_99 & 1) == 0)) && ((uVar12 & 0x1000000) == 0)) {
        if ((*(uint *)&text->field_0x90 & 1) == 0) {
          GetColorU32(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0);
          TableSetBgColor((ImGuiTableBgTarget)((ulong)in_stack_fffffffffffffef0 >> 0x20),
                          (ImU32)in_stack_fffffffffffffef0,iVar11);
        }
      }
      else {
        append_to_sort_specs = 0;
        local_a0 = GetColorU32(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0);
        TableSetBgColor((ImGuiTableBgTarget)((ulong)in_stack_fffffffffffffef0 >> 0x20),
                        (ImU32)in_stack_fffffffffffffef0,iVar11);
        RenderNavHighlight((ImRect *)CONCAT44(uVar12,IVar4),in_stack_ffffffffffffff7c,
                           in_stack_ffffffffffffff78);
      }
      if ((local_9a & 1) != 0) {
        text->HeldHeaderColumn = (ImGuiTableColumnIdx)i;
      }
      (pIVar14->DC).CursorPos.y = -(pos_max->Style).ItemSpacing.y * 0.5 + (pIVar14->DC).CursorPos.y;
      if (((((local_9a & 1) != 0) && ((text->Flags & 2U) != 0)) &&
          (bVar3 = IsMouseDragging((ImGuiMouseButton)in_stack_fffffffffffffed0,
                                   in_stack_fffffffffffffecc), bVar3)) &&
         ((pos_max->DragDropActive & 1U) == 0)) {
        text->ReorderColumn = (ImGuiTableColumnIdx)i;
        text->InstanceInteracted = text->InstanceCurrent;
        pIVar1 = &(pos_max->IO).MouseDelta;
        if ((pIVar1->x <= 0.0 && pIVar1->x != 0.0) && ((pos_max->IO).MousePos.x < IVar10.Min.x)) {
          if (text_size_if_known->PrevEnabledColumn == -1) {
            local_a8 = (ImGuiTableColumn *)0x0;
          }
          else {
            local_a8 = ImSpan<ImGuiTableColumn>::operator[]
                                 (&text->Columns,(int)text_size_if_known->PrevEnabledColumn);
          }
          if (((local_a8 != (ImGuiTableColumn *)0x0) &&
              (((text_size_if_known->Flags | local_a8->Flags) & 0x20U) == 0)) &&
             (text_size_if_known->IndexWithinEnabledSet < text->FreezeColumnsRequest ==
              local_a8->IndexWithinEnabledSet < text->FreezeColumnsRequest)) {
            text->ReorderColumnDir = -1;
          }
        }
        if ((0.0 < (pos_max->IO).MouseDelta.x) && (local_50 < (pos_max->IO).MousePos.x)) {
          if (text_size_if_known->NextEnabledColumn == -1) {
            local_b0 = (ImGuiTableColumn *)0x0;
          }
          else {
            local_b0 = ImSpan<ImGuiTableColumn>::operator[]
                                 (&text->Columns,(int)text_size_if_known->NextEnabledColumn);
          }
          if (((local_b0 != (ImGuiTableColumn *)0x0) &&
              (((text_size_if_known->Flags | local_b0->Flags) & 0x20U) == 0)) &&
             (text_size_if_known->IndexWithinEnabledSet < text->FreezeColumnsRequest ==
              local_b0->IndexWithinEnabledSet < text->FreezeColumnsRequest)) {
            text->ReorderColumnDir = '\x01';
          }
        }
      }
      iVar11 = (int)((ulong)in_stack_fffffffffffffed0 >> 0x20);
      local_b4 = (local_50 - fVar13) - local_74;
      fStack_44 = IVar2.y;
      if (((text->Flags & 8U) != 0) && ((text_size_if_known->Flags & 0x100U) == 0)) {
        if (text_size_if_known->SortOrder != -1) {
          local_b8 = ImMax<float>(IVar10.Min.x,(local_50 - fVar13) - local_74);
          local_bc = fStack_44;
          if ('\0' < text_size_if_known->SortOrder) {
            in_stack_fffffffffffffee4 = 0;
            GetColorU32(0,in_stack_fffffffffffffee0);
            PushStyleColor((ImGuiCol)fVar7,(ImU32)col_00);
            ImVec2::ImVec2(&local_c4,local_b8 + (pos_max->Style).ItemInnerSpacing.x,local_bc);
            IVar2.y = in_stack_ffffffffffffff24;
            IVar2.x = in_stack_ffffffffffffff20;
            RenderText(IVar2,(char *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                       in_stack_ffffffffffffff10,(bool)hide_text_after_hash);
            PopStyleColor(iVar11);
            local_b8 = local_74 + local_b8;
          }
          ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff34,local_b8,local_bc);
          GetColorU32(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0);
          IVar8.y = in_stack_ffffffffffffff34;
          IVar8.x = in_stack_ffffffffffffff30;
          RenderArrow((ImDrawList *)in_stack_ffffffffffffff28,IVar8,(ImU32)in_stack_ffffffffffffff24
                      ,(ImGuiDir)in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
        }
        if (((local_9b & 1) != 0) && (text->ReorderColumn != i)) {
          TableGetColumnNextSortDirection
                    ((ImGuiTableColumn *)
                     CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
          TableSetColumnSortDirection
                    ((int)fVar7,(ImGuiSortDirection)col_00,(bool)append_to_sort_specs);
        }
      }
      flags = (ImGuiHoveredFlags)pIVar14->DrawList;
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff28,local_b4,
                     fStack_44 + _y + (pos_max->Style).FramePadding.y);
      RenderTextEllipsis(unaff_retaddr,in_RDI,(ImVec2 *)pos_max,(float)((ulong)pIVar14 >> 0x20),
                         SUB84(pIVar14,0),(char *)text,(char *)CONCAT44(i,in_stack_ffffffffffffffd8)
                         ,(ImVec2 *)text_size_if_known);
      if (((local_b4 - local_48 < local_40) && ((local_99 & 1) != 0)) &&
         (pos_max->TooltipSlowDelay <= pos_max->HoveredIdNotActiveTimer &&
          pos_max->HoveredIdNotActiveTimer != pos_max->TooltipSlowDelay)) {
        SetTooltip("%.*s",(ulong)(uint)((int)pcVar5 - (int)in_RDI),in_RDI);
      }
      bVar3 = IsMouseReleased(1);
      if ((bVar3) && (bVar3 = IsItemHovered(flags), bVar3)) {
        TableOpenContextMenu(in_stack_fffffffffffffee4);
      }
    }
  }
  return;
}

Assistant:

void ImGui::TableHeader(const char* label)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return;

    ImGuiTable* table = g.CurrentTable;
    IM_ASSERT(table != NULL && "Need to call TableHeader() after BeginTable()!");
    IM_ASSERT(table->CurrentColumn != -1);
    const int column_n = table->CurrentColumn;
    ImGuiTableColumn* column = &table->Columns[column_n];

    // Label
    if (label == NULL)
        label = "";
    const char* label_end = FindRenderedTextEnd(label);
    ImVec2 label_size = CalcTextSize(label, label_end, true);
    ImVec2 label_pos = window->DC.CursorPos;

    // If we already got a row height, there's use that.
    // FIXME-TABLE: Padding problem if the correct outer-padding CellBgRect strays off our ClipRect?
    ImRect cell_r = TableGetCellBgRect(table, column_n);
    float label_height = ImMax(label_size.y, table->RowMinHeight - table->CellPaddingY * 2.0f);

    // Calculate ideal size for sort order arrow
    float w_arrow = 0.0f;
    float w_sort_text = 0.0f;
    char sort_order_suf[4] = "";
    const float ARROW_SCALE = 0.65f;
    if ((table->Flags & ImGuiTableFlags_Sortable) && !(column->Flags & ImGuiTableColumnFlags_NoSort))
    {
        w_arrow = ImFloor(g.FontSize * ARROW_SCALE + g.Style.FramePadding.x);
        if (column->SortOrder > 0)
        {
            ImFormatString(sort_order_suf, IM_ARRAYSIZE(sort_order_suf), "%d", column->SortOrder + 1);
            w_sort_text = g.Style.ItemInnerSpacing.x + CalcTextSize(sort_order_suf).x;
        }
    }

    // We feed our unclipped width to the column without writing on CursorMaxPos, so that column is still considering for merging.
    float max_pos_x = label_pos.x + label_size.x + w_sort_text + w_arrow;
    column->ContentMaxXHeadersUsed = ImMax(column->ContentMaxXHeadersUsed, column->WorkMaxX);
    column->ContentMaxXHeadersIdeal = ImMax(column->ContentMaxXHeadersIdeal, max_pos_x);

    // Keep header highlighted when context menu is open.
    const bool selected = (table->IsContextPopupOpen && table->ContextPopupColumn == column_n && table->InstanceInteracted == table->InstanceCurrent);
    ImGuiID id = window->GetID(label);
    ImRect bb(cell_r.Min.x, cell_r.Min.y, cell_r.Max.x, ImMax(cell_r.Max.y, cell_r.Min.y + label_height + g.Style.CellPadding.y * 2.0f));
    ItemSize(ImVec2(0.0f, label_height)); // Don't declare unclipped width, it'll be fed ContentMaxPosHeadersIdeal
    if (!ItemAdd(bb, id))
        return;

    //GetForegroundDrawList()->AddRect(cell_r.Min, cell_r.Max, IM_COL32(255, 0, 0, 255)); // [DEBUG]
    //GetForegroundDrawList()->AddRect(bb.Min, bb.Max, IM_COL32(255, 0, 0, 255)); // [DEBUG]

    // Using AllowItemOverlap mode because we cover the whole cell, and we want user to be able to submit subsequent items.
    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held, ImGuiButtonFlags_AllowItemOverlap);
    if (g.ActiveId != id)
        SetItemAllowOverlap();
    if (held || hovered || selected)
    {
        const ImU32 col = GetColorU32(held ? ImGuiCol_HeaderActive : hovered ? ImGuiCol_HeaderHovered : ImGuiCol_Header);
        //RenderFrame(bb.Min, bb.Max, col, false, 0.0f);
        TableSetBgColor(ImGuiTableBgTarget_CellBg, col, table->CurrentColumn);
        RenderNavHighlight(bb, id, ImGuiNavHighlightFlags_TypeThin | ImGuiNavHighlightFlags_NoRounding);
    }
    else
    {
        // Submit single cell bg color in the case we didn't submit a full header row
        if ((table->RowFlags & ImGuiTableRowFlags_Headers) == 0)
            TableSetBgColor(ImGuiTableBgTarget_CellBg, GetColorU32(ImGuiCol_TableHeaderBg), table->CurrentColumn);
    }
    if (held)
        table->HeldHeaderColumn = (ImGuiTableColumnIdx)column_n;
    window->DC.CursorPos.y -= g.Style.ItemSpacing.y * 0.5f;

    // Drag and drop to re-order columns.
    // FIXME-TABLE: Scroll request while reordering a column and it lands out of the scrolling zone.
    if (held && (table->Flags & ImGuiTableFlags_Reorderable) && IsMouseDragging(0) && !g.DragDropActive)
    {
        // While moving a column it will jump on the other side of the mouse, so we also test for MouseDelta.x
        table->ReorderColumn = (ImGuiTableColumnIdx)column_n;
        table->InstanceInteracted = table->InstanceCurrent;

        // We don't reorder: through the frozen<>unfrozen line, or through a column that is marked with ImGuiTableColumnFlags_NoReorder.
        if (g.IO.MouseDelta.x < 0.0f && g.IO.MousePos.x < cell_r.Min.x)
            if (ImGuiTableColumn* prev_column = (column->PrevEnabledColumn != -1) ? &table->Columns[column->PrevEnabledColumn] : NULL)
                if (!((column->Flags | prev_column->Flags) & ImGuiTableColumnFlags_NoReorder))
                    if ((column->IndexWithinEnabledSet < table->FreezeColumnsRequest) == (prev_column->IndexWithinEnabledSet < table->FreezeColumnsRequest))
                        table->ReorderColumnDir = -1;
        if (g.IO.MouseDelta.x > 0.0f && g.IO.MousePos.x > cell_r.Max.x)
            if (ImGuiTableColumn* next_column = (column->NextEnabledColumn != -1) ? &table->Columns[column->NextEnabledColumn] : NULL)
                if (!((column->Flags | next_column->Flags) & ImGuiTableColumnFlags_NoReorder))
                    if ((column->IndexWithinEnabledSet < table->FreezeColumnsRequest) == (next_column->IndexWithinEnabledSet < table->FreezeColumnsRequest))
                        table->ReorderColumnDir = +1;
    }

    // Sort order arrow
    const float ellipsis_max = cell_r.Max.x - w_arrow - w_sort_text;
    if ((table->Flags & ImGuiTableFlags_Sortable) && !(column->Flags & ImGuiTableColumnFlags_NoSort))
    {
        if (column->SortOrder != -1)
        {
            float x = ImMax(cell_r.Min.x, cell_r.Max.x - w_arrow - w_sort_text);
            float y = label_pos.y;
            if (column->SortOrder > 0)
            {
                PushStyleColor(ImGuiCol_Text, GetColorU32(ImGuiCol_Text, 0.70f));
                RenderText(ImVec2(x + g.Style.ItemInnerSpacing.x, y), sort_order_suf);
                PopStyleColor();
                x += w_sort_text;
            }
            RenderArrow(window->DrawList, ImVec2(x, y), GetColorU32(ImGuiCol_Text), column->SortDirection == ImGuiSortDirection_Ascending ? ImGuiDir_Up : ImGuiDir_Down, ARROW_SCALE);
        }

        // Handle clicking on column header to adjust Sort Order
        if (pressed && table->ReorderColumn != column_n)
        {
            ImGuiSortDirection sort_direction = TableGetColumnNextSortDirection(column);
            TableSetColumnSortDirection(column_n, sort_direction, g.IO.KeyShift);
        }
    }

    // Render clipped label. Clipping here ensure that in the majority of situations, all our header cells will
    // be merged into a single draw call.
    //window->DrawList->AddCircleFilled(ImVec2(ellipsis_max, label_pos.y), 40, IM_COL32_WHITE);
    RenderTextEllipsis(window->DrawList, label_pos, ImVec2(ellipsis_max, label_pos.y + label_height + g.Style.FramePadding.y), ellipsis_max, ellipsis_max, label, label_end, &label_size);

    const bool text_clipped = label_size.x > (ellipsis_max - label_pos.x);
    if (text_clipped && hovered && g.HoveredIdNotActiveTimer > g.TooltipSlowDelay)
        SetTooltip("%.*s", (int)(label_end - label), label);

    // We don't use BeginPopupContextItem() because we want the popup to stay up even after the column is hidden
    if (IsMouseReleased(1) && IsItemHovered())
        TableOpenContextMenu(column_n);
}